

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O2

shared_ptr<SchemePair> __thiscall SchemeVector::to_list(SchemeVector *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long in_RSI;
  __normal_iterator<const_std::shared_ptr<SchemeObject>_*,_std::vector<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_>
  __tmp;
  shared_ptr<SchemePair> *__args_1;
  shared_ptr<SchemePair> sVar2;
  __shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  sVar2 = std::dynamic_pointer_cast<SchemePair,SchemeObject>((shared_ptr<SchemeObject> *)this);
  _Var1 = sVar2.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  __args_1 = *(shared_ptr<SchemePair> **)(in_RSI + 0x10);
  while (__args_1 != *(shared_ptr<SchemePair> **)(in_RSI + 8)) {
    __args_1 = __args_1 + -1;
    std::make_shared<SchemePair,std::shared_ptr<SchemeObject>const&,std::shared_ptr<SchemePair>&>
              ((shared_ptr<SchemeObject> *)&_Stack_38,__args_1);
    std::__shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2> *)this,&_Stack_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
    _Var1._M_pi = extraout_RDX;
  }
  sVar2.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<SchemePair>)sVar2.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SchemePair> SchemeVector::to_list() const
{
    auto l = std::dynamic_pointer_cast<SchemePair>(scheme_nil);
    for(auto it=vec.rbegin(); it != vec.rend(); ++it)
    {
        l = std::make_shared<SchemePair>(*it, l);
    }
    return l;
}